

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

int TextEndsWithNewline(Lexer *lexer,Node *node,uint mode)

{
  uint uVar1;
  uint uVar2;
  Bool BVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  
  iVar5 = -1;
  if (((mode & 0x12) != 0) && (BVar3 = prvTidynodeIsText(node), BVar3 != no)) {
    uVar1 = node->start;
    uVar2 = node->end;
    if (uVar1 < uVar2) {
      uVar4 = uVar2 - 1;
      uVar8 = uVar2;
      if (uVar1 < uVar4) {
        uVar8 = uVar1 + 1;
        pbVar9 = (byte *)(lexer->lexbuf + uVar4);
        uVar6 = uVar2;
        do {
          if ((0x20 < (ulong)*pbVar9) || ((0x100002200U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) {
            uVar4 = uVar6 - 1;
            uVar8 = uVar6;
            break;
          }
          uVar7 = uVar6 - 2;
          pbVar9 = pbVar9 + -1;
          uVar4 = uVar1;
          uVar6 = uVar6 - 1;
        } while (uVar1 < uVar7);
      }
      iVar5 = -1;
      if (lexer->lexbuf[uVar4] == '\n') {
        iVar5 = uVar2 - uVar8;
      }
    }
  }
  return iVar5;
}

Assistant:

static int TextEndsWithNewline(Lexer *lexer, Node *node, uint mode )
{
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsText)(node) && node->end > node->start )
    {
        uint ch, ix = node->end - 1;
        /*\
         *  Skip non-newline whitespace.
         *  Issue #379 - Only if ix is GT start can it be decremented!
        \*/
        while ( ix > node->start && (ch = (lexer->lexbuf[ix] & 0xff))
                 && ( ch == ' ' || ch == '\t' || ch == '\r' ) )
            --ix;

        if ( lexer->lexbuf[ ix ] == '\n' )
          return node->end - ix - 1; /* #543262 tidy eats all memory */
    }
    return -1;
}